

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O2

_Bool l_table_get_integer(lua_State *L,int tab,char *key,lua_Integer *result,
                         lua_Integer default_value)

{
  undefined1 extraout_AL;
  int iVar1;
  lua_Integer lVar2;
  undefined4 in_register_00000034;
  
  lua_pushstring(L,(char *)CONCAT44(in_register_00000034,tab));
  lua_gettable(L,2);
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = lua_tointegerx(L,-1,(int *)0x0);
  }
  *(lua_Integer *)key = lVar2;
  lua_settop(L,-2);
  return (_Bool)extraout_AL;
}

Assistant:

static bool l_table_get_integer(lua_State *L, int tab, const char *key,
                                lua_Integer *result,
                                lua_Integer default_value) {
  bool rc = false;
  lua_pushstring(L, key);
  lua_gettable(L, tab); /* get table[key] */
  if (!lua_isnumber(L, -1))
    *result = default_value;
  else {
    *result = lua_tointeger(L, -1);
    rc = true;
  }
  lua_pop(L, 1); /* remove number */
  return rc;
}